

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O0

void uss_return_handle_raw(UnixSftpServer *uss,SftpReplyBuilder *reply,int index,uint seq)

{
  ptrlen handle;
  undefined1 local_28 [4];
  undefined1 auStack_24 [4];
  uchar handlebuf [8];
  uint seq_local;
  int index_local;
  SftpReplyBuilder *reply_local;
  UnixSftpServer *uss_local;
  
  handlebuf._0_4_ = seq;
  handlebuf._4_4_ = index;
  PUT_32BIT_MSB_FIRST(local_28,index);
  PUT_32BIT_MSB_FIRST(auStack_24,handlebuf._0_4_);
  des_encrypt_xdmauth(uss->handlekey,local_28,8);
  handle = make_ptrlen(local_28,8);
  fxp_reply_handle(reply,handle);
  return;
}

Assistant:

static void uss_return_handle_raw(
    UnixSftpServer *uss, SftpReplyBuilder *reply, int index, unsigned seq)
{
    unsigned char handlebuf[8];
    PUT_32BIT_MSB_FIRST(handlebuf, index);
    PUT_32BIT_MSB_FIRST(handlebuf + 4, seq);
    des_encrypt_xdmauth(uss->handlekey, handlebuf, 8);
    fxp_reply_handle(reply, make_ptrlen(handlebuf, 8));
}